

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.c
# Opt level: O1

int skip_to_next_token(void)

{
  FILE *__stream;
  ushort *puVar1;
  int iVar2;
  ushort **ppuVar3;
  int iVar4;
  
  iVar4 = file_stack_ptr;
  if (0 < file_stack_ptr) {
    ppuVar3 = __ctype_b_loc();
    do {
      __stream = (FILE *)file_stack[iVar4 - 1U].fp;
LAB_00105a3f:
      puVar1 = *ppuVar3;
      iVar2 = fgetc(__stream);
      if ((*(byte *)((long)puVar1 + (long)iVar2 * 2 + 1) & 0x20) != 0) goto code_r0x00105a55;
      if (iVar2 == 0x3b) {
        do {
          iVar2 = getc(__stream);
          if (iVar2 == -1) goto LAB_00105a3f;
        } while (iVar2 != 10);
        goto LAB_00105a5a;
      }
      if (iVar2 != -1) {
        return iVar2;
      }
      if (0 < file_stack_ptr) {
        file_stack_ptr = file_stack_ptr - 1;
        fclose((FILE *)file_stack[(uint)file_stack_ptr].fp);
      }
      iVar4 = file_stack_ptr;
    } while (0 < file_stack_ptr);
  }
  return -1;
code_r0x00105a55:
  if (iVar2 == 10) {
LAB_00105a5a:
    file_stack[iVar4 - 1U].lineno = file_stack[iVar4 - 1U].lineno + 1;
  }
  goto LAB_00105a3f;
}

Assistant:

int
skip_to_next_token ()
{
  InputFile *f;
  FILE *fp;
  int c;

  /* Skip leading whitespace & handle EOF by popping up one file. */
  while (1)
    {
      if (file_stack_ptr <= 0)
	return EOF;

      f = &file_stack[file_stack_ptr - 1];
      fp = f->fp;

      /* Skip leading spaces & comments */
      while (1)
	{
	  while (isspace (c = fgetc (fp)))  /* Linux dies if you use getc. */
	    if (c == '\n') f->lineno++;
	  
	  if (c == ';')    /* Skip over comments */
	    {
	      while ((c = getc (fp)) != '\n' && c != EOF);
	      if (c == '\n') f->lineno++;
	    }
	  else break;
	}
  
      if (c == EOF)
	close_file ();
      else break;
    }

  return c;
}